

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

size_t decodeCobs(void *buffer,void *p,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  uint8_t *src;
  uint8_t *dst;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  
  pcVar1 = (char *)buffer;
  if (size != 0) {
    sVar2 = 0;
    cVar4 = '\0';
    cVar5 = -1;
    do {
      cVar3 = *(char *)((long)p + sVar2);
      cVar6 = cVar3;
      if (cVar4 == '\0') {
        cVar4 = cVar3;
        if (cVar3 != '\0' && cVar5 != -1) {
          cVar5 = cVar3;
          cVar6 = '\0';
          goto LAB_0011720e;
        }
        if (cVar3 == '\0') break;
      }
      else {
LAB_0011720e:
        cVar3 = cVar5;
        *pcVar1 = cVar6;
        pcVar1 = pcVar1 + 1;
      }
      cVar4 = cVar4 + -1;
      sVar2 = sVar2 + 1;
      cVar5 = cVar3;
    } while (size != sVar2);
  }
  return (long)pcVar1 - (long)buffer;
}

Assistant:

size_t decodeCobs(
	void* buffer, // must be big enough
	void const* p,
	size_t size
) {
	uint8_t const* src = (uint8_t*)p; // encoded input byte pointer
	uint8_t* dst = (uint8_t*)buffer; // decoded output byte pointer
	uint8_t code = 0xff;
	uint8_t block = 0;

	for (; size--; block--) {
		if (block) // decode block byte
			*dst++ = *src++;
		else {
			block = *src++; // fetch the next block length
			if (block && code != 0xff) // encoded zero, write it unless it's delimiter.
				*dst++ = 0;
			code = block;
			if (!code) // delimiter code found
				break;
		}
	}

	return dst - (uint8_t*)buffer;
}